

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkeletonMeshBuilder.cpp
# Opt level: O1

void __thiscall Assimp::SkeletonMeshBuilder::CreateGeometry(SkeletonMeshBuilder *this,aiNode *pNode)

{
  pointer *ppaVar1;
  pointer *ppFVar2;
  vector<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
  *this_00;
  pointer *pppaVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  iterator iVar18;
  iterator iVar19;
  iterator iVar20;
  iterator __position;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined8 uVar25;
  aiNode **ppaVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  undefined4 uVar33;
  undefined4 uVar34;
  uint uVar35;
  aiNode *paVar36;
  aiMatrix4x4t<float> *paVar37;
  aiVertexWeight *paVar38;
  pointer paVar39;
  ulong uVar40;
  ulong uVar41;
  float fVar42;
  float fVar43;
  float extraout_XMM0_Db;
  float extraout_XMM0_Dc;
  uint extraout_XMM0_Dd;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  aiBone *bone;
  aiVector3D childpos;
  aiVector3t<float> local_178;
  float local_16c;
  undefined1 local_168 [56];
  aiNode **ppaStack_130;
  float local_128;
  float fStack_124;
  float fStack_120;
  uint uStack_11c;
  undefined1 local_118 [8];
  float fStack_110;
  uint uStack_10c;
  vector<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
  *local_100;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  uint uStack_bc;
  undefined1 local_b8 [8];
  float fStack_b0;
  uint uStack_ac;
  float local_9c;
  float local_98;
  float local_94;
  float local_90;
  float local_8c;
  float local_88;
  float local_84;
  float local_80;
  float local_7c;
  float local_78;
  float local_74;
  ulong local_70;
  float local_68;
  float fStack_64;
  uint uStack_60;
  uint uStack_5c;
  float local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  aiNode *local_38;
  
  uVar41 = ((long)(this->mVertices).
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)(this->mVertices).
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
  local_70 = uVar41;
  if ((pNode->mNumChildren == 0) || (this->mKnobsOnly != false)) {
    fVar42 = (pNode->mTransformation).a4;
    fVar43 = (pNode->mTransformation).b4;
    fVar47 = (pNode->mTransformation).c4;
    fStack_124 = 0.0;
    fStack_120 = 0.0;
    uStack_11c = 0;
    fVar42 = fVar47 * fVar47 + fVar42 * fVar42 + fVar43 * fVar43;
    if (fVar42 < 0.0) {
      fVar42 = sqrtf(fVar42);
      fStack_124 = extraout_XMM0_Db;
      fStack_120 = extraout_XMM0_Dc;
      uStack_11c = extraout_XMM0_Dd;
    }
    else {
      fVar42 = SQRT(fVar42);
    }
    local_128 = fVar42 * 0.18;
    local_168._0_4_ = -local_128;
    local_118 = (undefined1  [8])(CONCAT44(fStack_124,local_128) ^ 0x8000000080000000);
    fStack_110 = -fStack_120;
    uStack_10c = uStack_11c ^ 0x80000000;
    local_168._4_4_ = 0.0;
    local_168._8_4_ = 0.0;
    iVar18._M_current =
         (this->mVertices).
         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar18._M_current ==
        (this->mVertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,iVar18,
                 (aiVector3t<float> *)local_168);
    }
    else {
      (iVar18._M_current)->z = 0.0;
      (iVar18._M_current)->x = (float)(int)(ulong)(uint)local_168._0_4_;
      (iVar18._M_current)->y = (float)(int)((ulong)(uint)local_168._0_4_ >> 0x20);
      ppaVar1 = &(this->mVertices).
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppaVar1 = *ppaVar1 + 1;
    }
    local_168._0_4_ = 0.0;
    local_168._4_4_ = local_128;
    local_168._8_4_ = 0.0;
    iVar18._M_current =
         (this->mVertices).
         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar18._M_current ==
        (this->mVertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,iVar18,
                 (aiVector3t<float> *)local_168);
    }
    else {
      (iVar18._M_current)->z = 0.0;
      (iVar18._M_current)->x = (float)(int)((ulong)(uint)local_128 << 0x20);
      (iVar18._M_current)->y = (float)(int)(((ulong)(uint)local_128 << 0x20) >> 0x20);
      ppaVar1 = &(this->mVertices).
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppaVar1 = *ppaVar1 + 1;
    }
    local_168._0_4_ = 0.0;
    local_168._4_4_ = 0.0;
    local_168._8_4_ = local_118._0_4_;
    iVar18._M_current =
         (this->mVertices).
         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar18._M_current ==
        (this->mVertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,iVar18,
                 (aiVector3t<float> *)local_168);
    }
    else {
      (iVar18._M_current)->z = (float)local_118._0_4_;
      (iVar18._M_current)->x = 0.0;
      (iVar18._M_current)->y = 0.0;
      ppaVar1 = &(this->mVertices).
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppaVar1 = *ppaVar1 + 1;
    }
    local_168._0_4_ = 0.0;
    local_168._4_4_ = local_128;
    local_168._8_4_ = 0.0;
    iVar18._M_current =
         (this->mVertices).
         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar18._M_current ==
        (this->mVertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,iVar18,
                 (aiVector3t<float> *)local_168);
    }
    else {
      (iVar18._M_current)->z = 0.0;
      (iVar18._M_current)->x = (float)(int)((ulong)(uint)local_128 << 0x20);
      (iVar18._M_current)->y = (float)(int)(((ulong)(uint)local_128 << 0x20) >> 0x20);
      ppaVar1 = &(this->mVertices).
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppaVar1 = *ppaVar1 + 1;
    }
    local_168._0_4_ = local_128;
    local_168._4_4_ = 0.0;
    local_168._8_4_ = 0.0;
    iVar18._M_current =
         (this->mVertices).
         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar18._M_current ==
        (this->mVertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,iVar18,
                 (aiVector3t<float> *)local_168);
    }
    else {
      (iVar18._M_current)->z = 0.0;
      (iVar18._M_current)->x = (float)(int)(ulong)(uint)local_128;
      (iVar18._M_current)->y = (float)(int)((ulong)(uint)local_128 >> 0x20);
      ppaVar1 = &(this->mVertices).
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppaVar1 = *ppaVar1 + 1;
    }
    local_168._0_4_ = 0.0;
    local_168._4_4_ = 0.0;
    local_168._8_4_ = local_118._0_4_;
    iVar18._M_current =
         (this->mVertices).
         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar18._M_current ==
        (this->mVertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,iVar18,
                 (aiVector3t<float> *)local_168);
    }
    else {
      (iVar18._M_current)->z = (float)local_118._0_4_;
      (iVar18._M_current)->x = 0.0;
      (iVar18._M_current)->y = 0.0;
      ppaVar1 = &(this->mVertices).
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppaVar1 = *ppaVar1 + 1;
    }
    local_168._0_4_ = local_128;
    local_168._4_4_ = 0.0;
    local_168._8_4_ = 0.0;
    iVar18._M_current =
         (this->mVertices).
         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar18._M_current ==
        (this->mVertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,iVar18,
                 (aiVector3t<float> *)local_168);
    }
    else {
      (iVar18._M_current)->z = 0.0;
      (iVar18._M_current)->x = (float)(int)(ulong)(uint)local_128;
      (iVar18._M_current)->y = (float)(int)((ulong)(uint)local_128 >> 0x20);
      ppaVar1 = &(this->mVertices).
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppaVar1 = *ppaVar1 + 1;
    }
    local_168._0_4_ = 0.0;
    local_168._4_4_ = local_118._0_4_;
    local_168._8_4_ = 0.0;
    iVar18._M_current =
         (this->mVertices).
         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar18._M_current ==
        (this->mVertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,iVar18,
                 (aiVector3t<float> *)local_168);
    }
    else {
      (iVar18._M_current)->z = 0.0;
      (iVar18._M_current)->x = (float)(int)((ulong)(uint)local_118._0_4_ << 0x20);
      (iVar18._M_current)->y = (float)(int)(((ulong)(uint)local_118._0_4_ << 0x20) >> 0x20);
      ppaVar1 = &(this->mVertices).
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppaVar1 = *ppaVar1 + 1;
    }
    local_168._0_4_ = 0.0;
    local_168._4_4_ = 0.0;
    local_168._8_4_ = local_118._0_4_;
    iVar18._M_current =
         (this->mVertices).
         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar18._M_current ==
        (this->mVertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,iVar18,
                 (aiVector3t<float> *)local_168);
    }
    else {
      (iVar18._M_current)->z = (float)local_118._0_4_;
      (iVar18._M_current)->x = 0.0;
      (iVar18._M_current)->y = 0.0;
      ppaVar1 = &(this->mVertices).
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppaVar1 = *ppaVar1 + 1;
    }
    local_168._0_4_ = 0.0;
    local_168._4_4_ = local_118._0_4_;
    local_168._8_4_ = 0.0;
    iVar18._M_current =
         (this->mVertices).
         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar18._M_current ==
        (this->mVertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,iVar18,
                 (aiVector3t<float> *)local_168);
    }
    else {
      (iVar18._M_current)->z = 0.0;
      (iVar18._M_current)->x = (float)(int)((ulong)(uint)local_118._0_4_ << 0x20);
      (iVar18._M_current)->y = (float)(int)(((ulong)(uint)local_118._0_4_ << 0x20) >> 0x20);
      ppaVar1 = &(this->mVertices).
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppaVar1 = *ppaVar1 + 1;
    }
    local_168._0_4_ = local_118._0_4_;
    local_168._4_4_ = 0.0;
    local_168._8_4_ = 0.0;
    iVar18._M_current =
         (this->mVertices).
         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar18._M_current ==
        (this->mVertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,iVar18,
                 (aiVector3t<float> *)local_168);
    }
    else {
      (iVar18._M_current)->z = 0.0;
      (iVar18._M_current)->x = (float)(int)(ulong)(uint)local_118._0_4_;
      (iVar18._M_current)->y = (float)(int)((ulong)(uint)local_118._0_4_ >> 0x20);
      ppaVar1 = &(this->mVertices).
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppaVar1 = *ppaVar1 + 1;
    }
    local_168._0_4_ = 0.0;
    local_168._4_4_ = 0.0;
    local_168._8_4_ = local_118._0_4_;
    iVar18._M_current =
         (this->mVertices).
         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar18._M_current ==
        (this->mVertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,iVar18,
                 (aiVector3t<float> *)local_168);
    }
    else {
      (iVar18._M_current)->z = (float)local_118._0_4_;
      (iVar18._M_current)->x = 0.0;
      (iVar18._M_current)->y = 0.0;
      ppaVar1 = &(this->mVertices).
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppaVar1 = *ppaVar1 + 1;
    }
    local_168._0_4_ = local_118._0_4_;
    local_168._4_4_ = 0.0;
    local_168._8_4_ = 0.0;
    iVar18._M_current =
         (this->mVertices).
         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar18._M_current ==
        (this->mVertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,iVar18,
                 (aiVector3t<float> *)local_168);
    }
    else {
      (iVar18._M_current)->z = 0.0;
      (iVar18._M_current)->x = (float)(int)(ulong)(uint)local_118._0_4_;
      (iVar18._M_current)->y = (float)(int)((ulong)(uint)local_118._0_4_ >> 0x20);
      ppaVar1 = &(this->mVertices).
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppaVar1 = *ppaVar1 + 1;
    }
    local_168._0_4_ = 0.0;
    local_168._4_4_ = 0.0;
    local_168._8_4_ = local_128;
    iVar18._M_current =
         (this->mVertices).
         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar18._M_current ==
        (this->mVertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,iVar18,
                 (aiVector3t<float> *)local_168);
    }
    else {
      (iVar18._M_current)->z = local_128;
      (iVar18._M_current)->x = 0.0;
      (iVar18._M_current)->y = 0.0;
      ppaVar1 = &(this->mVertices).
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppaVar1 = *ppaVar1 + 1;
    }
    local_168._0_4_ = 0.0;
    local_168._4_4_ = local_128;
    local_168._8_4_ = 0.0;
    iVar18._M_current =
         (this->mVertices).
         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar18._M_current ==
        (this->mVertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,iVar18,
                 (aiVector3t<float> *)local_168);
    }
    else {
      (iVar18._M_current)->z = 0.0;
      (iVar18._M_current)->x = (float)(int)((ulong)(uint)local_128 << 0x20);
      (iVar18._M_current)->y = (float)(int)(((ulong)(uint)local_128 << 0x20) >> 0x20);
      ppaVar1 = &(this->mVertices).
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppaVar1 = *ppaVar1 + 1;
    }
    local_168._0_4_ = 0.0;
    local_168._8_4_ = 0.0;
    iVar18._M_current =
         (this->mVertices).
         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar18._M_current ==
        (this->mVertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      local_168._4_4_ = local_128;
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,iVar18,
                 (aiVector3t<float> *)local_168);
    }
    else {
      (iVar18._M_current)->z = 0.0;
      (iVar18._M_current)->x = (float)(int)((ulong)(uint)local_128 << 0x20);
      (iVar18._M_current)->y = (float)(int)(((ulong)(uint)local_128 << 0x20) >> 0x20);
      ppaVar1 = &(this->mVertices).
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppaVar1 = *ppaVar1 + 1;
    }
    local_168._0_4_ = 0.0;
    local_168._4_4_ = 0.0;
    iVar18._M_current =
         (this->mVertices).
         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar18._M_current ==
        (this->mVertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      local_168._8_4_ = local_128;
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,iVar18,
                 (aiVector3t<float> *)local_168);
    }
    else {
      (iVar18._M_current)->z = local_128;
      (iVar18._M_current)->x = 0.0;
      (iVar18._M_current)->y = 0.0;
      ppaVar1 = &(this->mVertices).
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppaVar1 = *ppaVar1 + 1;
    }
    local_168._4_4_ = 0.0;
    local_168._8_4_ = 0.0;
    iVar18._M_current =
         (this->mVertices).
         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar18._M_current ==
        (this->mVertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      local_168._0_4_ = local_128;
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,iVar18,
                 (aiVector3t<float> *)local_168);
    }
    else {
      (iVar18._M_current)->z = 0.0;
      (iVar18._M_current)->x = (float)(int)(ulong)(uint)local_128;
      (iVar18._M_current)->y = (float)(int)((ulong)(uint)local_128 >> 0x20);
      ppaVar1 = &(this->mVertices).
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppaVar1 = *ppaVar1 + 1;
    }
    local_168._4_4_ = 0.0;
    local_168._8_4_ = 0.0;
    iVar18._M_current =
         (this->mVertices).
         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar18._M_current ==
        (this->mVertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      local_168._0_4_ = local_128;
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,iVar18,
                 (aiVector3t<float> *)local_168);
    }
    else {
      (iVar18._M_current)->z = 0.0;
      (iVar18._M_current)->x = (float)(int)(ulong)(uint)local_128;
      (iVar18._M_current)->y = (float)(int)((ulong)(uint)local_128 >> 0x20);
      ppaVar1 = &(this->mVertices).
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppaVar1 = *ppaVar1 + 1;
    }
    local_168._0_4_ = 0.0;
    local_168._4_4_ = 0.0;
    iVar18._M_current =
         (this->mVertices).
         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar18._M_current ==
        (this->mVertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      local_168._8_4_ = local_128;
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,iVar18,
                 (aiVector3t<float> *)local_168);
    }
    else {
      (iVar18._M_current)->z = local_128;
      (iVar18._M_current)->x = 0.0;
      (iVar18._M_current)->y = 0.0;
      ppaVar1 = &(this->mVertices).
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppaVar1 = *ppaVar1 + 1;
    }
    local_168._0_4_ = 0.0;
    local_168._4_4_ = local_118._0_4_;
    local_168._8_4_ = 0.0;
    iVar18._M_current =
         (this->mVertices).
         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar18._M_current ==
        (this->mVertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,iVar18,
                 (aiVector3t<float> *)local_168);
    }
    else {
      (iVar18._M_current)->z = 0.0;
      (iVar18._M_current)->x = (float)(int)((ulong)(uint)local_118._0_4_ << 0x20);
      (iVar18._M_current)->y = (float)(int)(((ulong)(uint)local_118._0_4_ << 0x20) >> 0x20);
      ppaVar1 = &(this->mVertices).
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppaVar1 = *ppaVar1 + 1;
    }
    local_168._0_4_ = 0.0;
    local_168._4_4_ = local_118._0_4_;
    local_168._8_4_ = 0.0;
    iVar18._M_current =
         (this->mVertices).
         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar18._M_current ==
        (this->mVertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,iVar18,
                 (aiVector3t<float> *)local_168);
    }
    else {
      (iVar18._M_current)->z = 0.0;
      (iVar18._M_current)->x = (float)(int)((ulong)(uint)local_118._0_4_ << 0x20);
      (iVar18._M_current)->y = (float)(int)(((ulong)(uint)local_118._0_4_ << 0x20) >> 0x20);
      ppaVar1 = &(this->mVertices).
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppaVar1 = *ppaVar1 + 1;
    }
    local_168._0_4_ = 0.0;
    local_168._4_4_ = 0.0;
    local_168._8_4_ = local_128;
    iVar18._M_current =
         (this->mVertices).
         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar18._M_current ==
        (this->mVertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,iVar18,
                 (aiVector3t<float> *)local_168);
    }
    else {
      (iVar18._M_current)->z = local_128;
      (iVar18._M_current)->x = 0.0;
      (iVar18._M_current)->y = 0.0;
      ppaVar1 = &(this->mVertices).
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppaVar1 = *ppaVar1 + 1;
    }
    local_168._0_4_ = local_118._0_4_;
    local_168._4_4_ = 0.0;
    local_168._8_4_ = 0.0;
    iVar18._M_current =
         (this->mVertices).
         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar18._M_current ==
        (this->mVertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,iVar18,
                 (aiVector3t<float> *)local_168);
    }
    else {
      (iVar18._M_current)->z = 0.0;
      (iVar18._M_current)->x = (float)(int)(ulong)(uint)local_118._0_4_;
      (iVar18._M_current)->y = (float)(int)((ulong)(uint)local_118._0_4_ >> 0x20);
      ppaVar1 = &(this->mVertices).
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppaVar1 = *ppaVar1 + 1;
    }
    this_00 = &this->mFaces;
    fVar42 = (float)uVar41;
    local_168._4_4_ = (int)fVar42 + 1;
    local_168._8_4_ = (int)fVar42 + 2;
    iVar20._M_current =
         (this->mFaces).
         super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar20._M_current ==
        (this->mFaces).
        super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      local_168._0_4_ = fVar42;
      std::
      vector<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
      ::_M_realloc_insert<Assimp::SkeletonMeshBuilder::Face>(this_00,iVar20,(Face *)local_168);
    }
    else {
      (iVar20._M_current)->mIndices[2] = local_168._8_4_;
      *(ulong *)(iVar20._M_current)->mIndices = CONCAT44(local_168._4_4_,fVar42);
      ppFVar2 = &(this->mFaces).
                 super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppFVar2 = *ppFVar2 + 1;
    }
    local_168._0_4_ = (int)fVar42 + 3;
    local_168._4_4_ = (int)fVar42 + 4;
    local_168._8_4_ = (int)fVar42 + 5;
    iVar20._M_current =
         (this->mFaces).
         super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar20._M_current ==
        (this->mFaces).
        super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
      ::_M_realloc_insert<Assimp::SkeletonMeshBuilder::Face>(this_00,iVar20,(Face *)local_168);
    }
    else {
      (iVar20._M_current)->mIndices[2] = local_168._8_4_;
      *(ulong *)(iVar20._M_current)->mIndices = CONCAT44(local_168._4_4_,local_168._0_4_);
      ppFVar2 = &(this->mFaces).
                 super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppFVar2 = *ppFVar2 + 1;
    }
    local_168._0_4_ = (int)fVar42 + 6;
    local_168._4_4_ = (int)fVar42 + 7;
    local_168._8_4_ = (int)fVar42 + 8;
    iVar20._M_current =
         (this->mFaces).
         super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar20._M_current ==
        (this->mFaces).
        super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
      ::_M_realloc_insert<Assimp::SkeletonMeshBuilder::Face>(this_00,iVar20,(Face *)local_168);
    }
    else {
      (iVar20._M_current)->mIndices[2] = local_168._8_4_;
      *(ulong *)(iVar20._M_current)->mIndices = CONCAT44(local_168._4_4_,local_168._0_4_);
      ppFVar2 = &(this->mFaces).
                 super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppFVar2 = *ppFVar2 + 1;
    }
    local_168._0_4_ = (int)fVar42 + 9;
    local_168._4_4_ = (int)fVar42 + 10;
    local_168._8_4_ = (int)fVar42 + 0xb;
    iVar20._M_current =
         (this->mFaces).
         super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar20._M_current ==
        (this->mFaces).
        super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
      ::_M_realloc_insert<Assimp::SkeletonMeshBuilder::Face>(this_00,iVar20,(Face *)local_168);
    }
    else {
      (iVar20._M_current)->mIndices[2] = local_168._8_4_;
      *(ulong *)(iVar20._M_current)->mIndices = CONCAT44(local_168._4_4_,local_168._0_4_);
      ppFVar2 = &(this->mFaces).
                 super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppFVar2 = *ppFVar2 + 1;
    }
    local_168._0_4_ = (int)fVar42 + 0xc;
    local_168._4_4_ = (int)fVar42 + 0xd;
    local_168._8_4_ = (int)fVar42 + 0xe;
    iVar20._M_current =
         (this->mFaces).
         super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar20._M_current ==
        (this->mFaces).
        super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
      ::_M_realloc_insert<Assimp::SkeletonMeshBuilder::Face>(this_00,iVar20,(Face *)local_168);
    }
    else {
      (iVar20._M_current)->mIndices[2] = local_168._8_4_;
      *(ulong *)(iVar20._M_current)->mIndices = CONCAT44(local_168._4_4_,local_168._0_4_);
      ppFVar2 = &(this->mFaces).
                 super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppFVar2 = *ppFVar2 + 1;
    }
    local_168._0_4_ = (int)fVar42 + 0xf;
    local_168._4_4_ = (int)fVar42 + 0x10;
    local_168._8_4_ = (int)fVar42 + 0x11;
    iVar20._M_current =
         (this->mFaces).
         super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar20._M_current ==
        (this->mFaces).
        super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
      ::_M_realloc_insert<Assimp::SkeletonMeshBuilder::Face>(this_00,iVar20,(Face *)local_168);
    }
    else {
      (iVar20._M_current)->mIndices[2] = local_168._8_4_;
      *(ulong *)(iVar20._M_current)->mIndices = CONCAT44(local_168._4_4_,local_168._0_4_);
      ppFVar2 = &(this->mFaces).
                 super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppFVar2 = *ppFVar2 + 1;
    }
    local_168._0_4_ = (int)fVar42 + 0x12;
    local_168._4_4_ = (int)fVar42 + 0x13;
    local_168._8_4_ = (int)fVar42 + 0x14;
    iVar20._M_current =
         (this->mFaces).
         super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar20._M_current ==
        (this->mFaces).
        super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
      ::_M_realloc_insert<Assimp::SkeletonMeshBuilder::Face>(this_00,iVar20,(Face *)local_168);
    }
    else {
      (iVar20._M_current)->mIndices[2] = local_168._8_4_;
      *(ulong *)(iVar20._M_current)->mIndices = CONCAT44(local_168._4_4_,local_168._0_4_);
      ppFVar2 = &(this->mFaces).
                 super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppFVar2 = *ppFVar2 + 1;
    }
    local_168._0_4_ = (int)fVar42 + 0x15;
    local_168._4_4_ = (int)fVar42 + 0x16;
    local_168._8_4_ = (int)fVar42 + 0x17;
    iVar20._M_current =
         (this->mFaces).
         super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar20._M_current ==
        (this->mFaces).
        super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
      ::_M_realloc_insert<Assimp::SkeletonMeshBuilder::Face>(this_00,iVar20,(Face *)local_168);
    }
    else {
      (iVar20._M_current)->mIndices[2] = local_168._8_4_;
      *(ulong *)(iVar20._M_current)->mIndices = CONCAT44(local_168._4_4_,local_168._0_4_);
      ppFVar2 = &(this->mFaces).
                 super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppFVar2 = *ppFVar2 + 1;
    }
  }
  else if (pNode->mNumChildren != 0) {
    local_100 = &this->mFaces;
    uVar41 = 0;
    do {
      paVar36 = pNode->mChildren[uVar41];
      local_168._0_4_ = (paVar36->mTransformation).a4;
      local_168._4_4_ = (paVar36->mTransformation).b4;
      local_168._8_4_ = (paVar36->mTransformation).c4;
      fVar42 = (float)local_168._8_4_ * (float)local_168._8_4_ +
               (float)local_168._0_4_ * (float)local_168._0_4_ +
               (float)local_168._4_4_ * (float)local_168._4_4_;
      if (fVar42 < 0.0) {
        fVar42 = sqrtf(fVar42);
      }
      else {
        fVar42 = SQRT(fVar42);
      }
      if (0.0001 <= fVar42) {
        fVar43 = (float)local_168._8_4_ * (float)local_168._8_4_ +
                 (float)local_168._0_4_ * (float)local_168._0_4_ +
                 (float)local_168._4_4_ * (float)local_168._4_4_;
        local_16c = fVar42;
        if (fVar43 < 0.0) {
          local_128 = (float)local_168._0_4_;
          local_f8._0_4_ = local_168._8_4_;
          local_d8._0_4_ = local_168._4_4_;
          fVar43 = sqrtf(fVar43);
          fVar42 = (float)local_f8._0_4_;
          fVar47 = (float)local_d8._0_4_;
        }
        else {
          fVar43 = SQRT(fVar43);
          local_128 = (float)local_168._0_4_;
          fVar42 = (float)local_168._8_4_;
          fVar47 = (float)local_168._4_4_;
        }
        fVar43 = 1.0 / fVar43;
        local_128 = local_128 * fVar43;
        fVar47 = fVar47 * fVar43;
        fVar42 = fVar42 * fVar43;
        local_118._4_4_ = 0;
        fStack_110 = 0.0;
        uStack_10c = 0;
        fVar43 = 0.0;
        fVar44 = 1.0;
        if (ABS(fVar42 * 0.0 + local_128 + fVar47 * 0.0) <= 0.99) {
          fVar43 = 1.0;
          fVar44 = 0.0;
        }
        local_118._0_4_ = fVar47 * 0.0 - fVar44 * fVar42;
        fVar45 = fVar42 * fVar43 + local_128 * -0.0;
        fVar44 = local_128 * fVar44 - fVar43 * fVar47;
        _local_b8 = ZEXT416((uint)fVar45);
        fVar43 = fVar44 * fVar44 + (float)local_118._0_4_ * (float)local_118._0_4_ + fVar45 * fVar45
        ;
        if (fVar43 < 0.0) {
          _local_118 = ZEXT416((uint)local_118._0_4_);
          local_f8._0_4_ = fVar42;
          local_d8._0_4_ = fVar47;
          local_e8._0_4_ = fVar44;
          fVar43 = sqrtf(fVar43);
        }
        else {
          fVar43 = SQRT(fVar43);
          local_f8._0_4_ = fVar42;
          local_e8._0_4_ = fVar44;
          local_d8._0_4_ = fVar47;
        }
        fVar43 = 1.0 / fVar43;
        local_118._0_4_ = (float)local_118._0_4_ * fVar43;
        local_b8._0_4_ = (float)local_b8._0_4_ * fVar43;
        fVar43 = fVar43 * (float)local_e8._0_4_;
        fVar47 = (float)local_b8._0_4_ * (float)local_f8._0_4_ - (float)local_d8._0_4_ * fVar43;
        fVar42 = (float)local_f8._0_4_ * (float)local_118._0_4_;
        local_f8 = ZEXT416((uint)fVar43);
        fVar42 = fVar43 * local_128 - fVar42;
        local_e8._0_4_ =
             (float)local_118._0_4_ * (float)local_d8._0_4_ - local_128 * (float)local_b8._0_4_;
        local_d8 = ZEXT416((uint)fVar42);
        fStack_124 = (float)local_b8._4_4_;
        fStack_120 = fStack_b0;
        uStack_11c = uStack_ac;
        local_e8._4_4_ = local_118._4_4_;
        local_e8._8_4_ = fStack_110;
        local_e8._12_4_ = uStack_10c;
        fVar42 = (float)local_e8._0_4_ * (float)local_e8._0_4_ + fVar47 * fVar47 + fVar42 * fVar42;
        local_128 = fVar47;
        if (fVar42 < 0.0) {
          fVar42 = sqrtf(fVar42);
          fVar43 = (float)local_118._0_4_;
          uVar35 = local_118._4_4_;
        }
        else {
          fVar42 = SQRT(fVar42);
          fVar43 = (float)local_118._0_4_;
          uVar35 = local_118._4_4_;
        }
        uStack_54 = local_f8._4_4_ ^ 0x80000000;
        uStack_50 = local_f8._8_4_ ^ 0x80000000;
        uStack_4c = local_f8._12_4_ ^ 0x80000000;
        uStack_60 = uVar35 ^ 0x80000000;
        iVar18._M_current =
             (this->mVertices).
             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
        paVar39 = (this->mVertices).
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_start;
        uStack_5c = local_b8._4_4_ ^ 0x80000000;
        local_68 = -fVar43 * local_16c * 0.1;
        fStack_64 = -(float)local_b8._0_4_ * local_16c * 0.1;
        local_178.z = -(float)local_f8._0_4_ * local_16c * 0.1;
        local_178._0_8_ = CONCAT44(fStack_64,local_68);
        local_58 = local_178.z;
        if (iVar18._M_current ==
            (this->mVertices).
            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          local_c8 = fVar42;
          std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
          _M_realloc_insert<aiVector3t<float>>
                    ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,iVar18,
                     &local_178);
          fVar43 = (float)local_118._0_4_;
          uVar35 = local_118._4_4_;
          fVar42 = local_c8;
        }
        else {
          (iVar18._M_current)->z = local_178.z;
          *(undefined8 *)iVar18._M_current = local_178._0_8_;
          ppaVar1 = &(this->mVertices).
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppaVar1 = *ppaVar1 + 1;
        }
        iVar19._M_current =
             (this->mVertices).
             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar19._M_current ==
            (this->mVertices).
            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          local_c8 = fVar42;
          std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
          _M_realloc_insert<aiVector3t<float>const&>
                    ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,iVar19,
                     (aiVector3t<float> *)local_168);
          fVar43 = (float)local_118._0_4_;
          uVar35 = local_118._4_4_;
          fVar42 = local_c8;
        }
        else {
          (iVar19._M_current)->z = (float)local_168._8_4_;
          (iVar19._M_current)->x = (float)local_168._0_4_;
          (iVar19._M_current)->y = (float)local_168._4_4_;
          ppaVar1 = &(this->mVertices).
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppaVar1 = *ppaVar1 + 1;
        }
        fVar42 = 1.0 / fVar42;
        local_128 = local_128 * fVar42;
        local_d8._0_4_ = (float)local_d8._0_4_ * fVar42;
        fVar42 = fVar42 * (float)local_e8._0_4_;
        local_e8 = ZEXT416((uint)fVar42);
        fVar47 = -local_128 * local_16c * 0.1;
        fVar44 = -(float)local_d8._0_4_ * local_16c * 0.1;
        local_178.z = -fVar42 * local_16c * 0.1;
        local_178._0_8_ = CONCAT44(fVar44,fVar47);
        iVar19._M_current =
             (this->mVertices).
             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar19._M_current ==
            (this->mVertices).
            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          uStack_44 = 0x80000000;
          uStack_40 = 0x80000000;
          uStack_3c = 0x80000000;
          local_c8 = fVar47;
          fStack_c4 = fVar44;
          fStack_c0 = -fStack_124;
          uStack_bc = local_d8._4_4_ ^ 0x80000000;
          local_48 = local_178.z;
          std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
          _M_realloc_insert<aiVector3t<float>>
                    ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,iVar19,
                     &local_178);
          fVar43 = (float)local_118._0_4_;
          uVar35 = local_118._4_4_;
          local_178.z = local_48;
          fVar47 = local_c8;
          fVar44 = fStack_c4;
        }
        else {
          (iVar19._M_current)->z = local_178.z;
          *(undefined8 *)iVar19._M_current = local_178._0_8_;
          ppaVar1 = &(this->mVertices).
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppaVar1 = *ppaVar1 + 1;
        }
        local_178._0_8_ = CONCAT44(fVar44,fVar47);
        iVar19._M_current =
             (this->mVertices).
             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar19._M_current ==
            (this->mVertices).
            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
          _M_realloc_insert<aiVector3t<float>>
                    ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,iVar19,
                     &local_178);
          fVar43 = (float)local_118._0_4_;
          uVar35 = local_118._4_4_;
        }
        else {
          (iVar19._M_current)->z = local_178.z;
          *(undefined8 *)iVar19._M_current = local_178._0_8_;
          ppaVar1 = &(this->mVertices).
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppaVar1 = *ppaVar1 + 1;
        }
        iVar19._M_current =
             (this->mVertices).
             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar19._M_current ==
            (this->mVertices).
            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
          _M_realloc_insert<aiVector3t<float>const&>
                    ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,iVar19,
                     (aiVector3t<float> *)local_168);
          fVar43 = (float)local_118._0_4_;
          uVar35 = local_118._4_4_;
        }
        else {
          (iVar19._M_current)->z = (float)local_168._8_4_;
          (iVar19._M_current)->x = (float)local_168._0_4_;
          (iVar19._M_current)->y = (float)local_168._4_4_;
          ppaVar1 = &(this->mVertices).
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppaVar1 = *ppaVar1 + 1;
        }
        fVar42 = fVar43 * local_16c * 0.1;
        fVar43 = (float)local_b8._0_4_ * local_16c * 0.1;
        local_178.z = (float)local_f8._0_4_ * local_16c * 0.1;
        local_178._0_8_ = CONCAT44(fVar43,fVar42);
        local_f8._0_4_ = local_178.z;
        iVar19._M_current =
             (this->mVertices).
             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar19._M_current ==
            (this->mVertices).
            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          local_118._4_4_ = fVar43;
          local_118._0_4_ = fVar42;
          fStack_110 = (float)uVar35;
          uStack_10c = local_b8._4_4_;
          std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
          _M_realloc_insert<aiVector3t<float>>
                    ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,iVar19,
                     &local_178);
          fVar42 = (float)local_118._0_4_;
          fVar43 = (float)local_118._4_4_;
        }
        else {
          (iVar19._M_current)->z = local_178.z;
          *(undefined8 *)iVar19._M_current = local_178._0_8_;
          ppaVar1 = &(this->mVertices).
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppaVar1 = *ppaVar1 + 1;
        }
        local_178._0_8_ = CONCAT44(fVar43,fVar42);
        local_178.z = (float)local_f8._0_4_;
        iVar19._M_current =
             (this->mVertices).
             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar19._M_current ==
            (this->mVertices).
            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
          _M_realloc_insert<aiVector3t<float>>
                    ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,iVar19,
                     &local_178);
        }
        else {
          (iVar19._M_current)->z = (float)local_f8._0_4_;
          *(undefined8 *)iVar19._M_current = local_178._0_8_;
          ppaVar1 = &(this->mVertices).
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppaVar1 = *ppaVar1 + 1;
        }
        iVar19._M_current =
             (this->mVertices).
             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar19._M_current ==
            (this->mVertices).
            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
          _M_realloc_insert<aiVector3t<float>const&>
                    ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,iVar19,
                     (aiVector3t<float> *)local_168);
        }
        else {
          (iVar19._M_current)->z = (float)local_168._8_4_;
          (iVar19._M_current)->x = (float)local_168._0_4_;
          (iVar19._M_current)->y = (float)local_168._4_4_;
          ppaVar1 = &(this->mVertices).
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppaVar1 = *ppaVar1 + 1;
        }
        fVar42 = local_128 * local_16c * 0.1;
        fVar43 = (float)local_d8._0_4_ * local_16c * 0.1;
        local_178.z = (float)local_e8._0_4_ * local_16c * 0.1;
        local_178._0_8_ = CONCAT44(fVar43,fVar42);
        iVar19._M_current =
             (this->mVertices).
             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar19._M_current ==
            (this->mVertices).
            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          fStack_120 = fStack_124;
          uStack_11c = local_d8._4_4_;
          local_e8._0_4_ = local_178.z;
          local_128 = fVar42;
          fStack_124 = fVar43;
          std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
          _M_realloc_insert<aiVector3t<float>>
                    ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,iVar19,
                     &local_178);
          fVar42 = local_128;
          fVar43 = fStack_124;
          local_178.z = (float)local_e8._0_4_;
        }
        else {
          (iVar19._M_current)->z = local_178.z;
          *(undefined8 *)iVar19._M_current = local_178._0_8_;
          ppaVar1 = &(this->mVertices).
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppaVar1 = *ppaVar1 + 1;
        }
        local_178._0_8_ = CONCAT44(fVar43,fVar42);
        iVar19._M_current =
             (this->mVertices).
             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar19._M_current ==
            (this->mVertices).
            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
          _M_realloc_insert<aiVector3t<float>>
                    ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,iVar19,
                     &local_178);
        }
        else {
          (iVar19._M_current)->z = local_178.z;
          *(undefined8 *)iVar19._M_current = local_178._0_8_;
          ppaVar1 = &(this->mVertices).
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppaVar1 = *ppaVar1 + 1;
        }
        iVar19._M_current =
             (this->mVertices).
             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar19._M_current ==
            (this->mVertices).
            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
          _M_realloc_insert<aiVector3t<float>const&>
                    ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,iVar19,
                     (aiVector3t<float> *)local_168);
        }
        else {
          (iVar19._M_current)->z = (float)local_168._8_4_;
          (iVar19._M_current)->x = (float)local_168._0_4_;
          (iVar19._M_current)->y = (float)local_168._4_4_;
          ppaVar1 = &(this->mVertices).
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppaVar1 = *ppaVar1 + 1;
        }
        local_178._0_8_ = CONCAT44(fStack_64,local_68);
        local_178.z = local_58;
        iVar19._M_current =
             (this->mVertices).
             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar19._M_current ==
            (this->mVertices).
            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
          _M_realloc_insert<aiVector3t<float>>
                    ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)this,iVar19,
                     &local_178);
        }
        else {
          (iVar19._M_current)->z = local_58;
          *(undefined8 *)iVar19._M_current = local_178._0_8_;
          ppaVar1 = &(this->mVertices).
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppaVar1 = *ppaVar1 + 1;
        }
        fVar42 = (float)((int)((ulong)((long)iVar18._M_current - (long)paVar39) >> 2) * -0x55555555)
        ;
        local_178.z = (float)((int)fVar42 + 2);
        local_178.y = (float)((int)fVar42 + 1);
        local_178.x = fVar42;
        iVar20._M_current =
             (this->mFaces).
             super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar20._M_current ==
            (this->mFaces).
            super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
          ::_M_realloc_insert<Assimp::SkeletonMeshBuilder::Face>
                    (local_100,iVar20,(Face *)&local_178);
        }
        else {
          (iVar20._M_current)->mIndices[2] = (uint)local_178.z;
          (iVar20._M_current)->mIndices[0] = (uint)fVar42;
          (iVar20._M_current)->mIndices[1] = (int)fVar42 + 1;
          ppFVar2 = &(this->mFaces).
                     super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppFVar2 = *ppFVar2 + 1;
        }
        local_178.z = (float)((int)fVar42 + 5);
        local_178.y = (float)((int)fVar42 + 4);
        local_178.x = (float)((int)fVar42 + 3);
        iVar20._M_current =
             (this->mFaces).
             super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar20._M_current ==
            (this->mFaces).
            super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
          ::_M_realloc_insert<Assimp::SkeletonMeshBuilder::Face>
                    (local_100,iVar20,(Face *)&local_178);
        }
        else {
          (iVar20._M_current)->mIndices[2] = (uint)local_178.z;
          (iVar20._M_current)->mIndices[0] = (int)fVar42 + 3;
          (iVar20._M_current)->mIndices[1] = (int)fVar42 + 4;
          ppFVar2 = &(this->mFaces).
                     super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppFVar2 = *ppFVar2 + 1;
        }
        local_178.z = (float)((int)fVar42 + 8);
        local_178.y = (float)((int)fVar42 + 7);
        local_178.x = (float)((int)fVar42 + 6);
        iVar20._M_current =
             (this->mFaces).
             super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar20._M_current ==
            (this->mFaces).
            super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
          ::_M_realloc_insert<Assimp::SkeletonMeshBuilder::Face>
                    (local_100,iVar20,(Face *)&local_178);
        }
        else {
          (iVar20._M_current)->mIndices[2] = (uint)local_178.z;
          (iVar20._M_current)->mIndices[0] = (int)fVar42 + 6;
          (iVar20._M_current)->mIndices[1] = (int)fVar42 + 7;
          ppFVar2 = &(this->mFaces).
                     super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppFVar2 = *ppFVar2 + 1;
        }
        local_178.z = (float)((int)fVar42 + 0xb);
        local_178.y = (float)((int)fVar42 + 10);
        local_178.x = (float)((int)fVar42 + 9);
        iVar20._M_current =
             (this->mFaces).
             super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar20._M_current ==
            (this->mFaces).
            super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
          ::_M_realloc_insert<Assimp::SkeletonMeshBuilder::Face>
                    (local_100,iVar20,(Face *)&local_178);
        }
        else {
          (iVar20._M_current)->mIndices[2] = (uint)local_178.z;
          (iVar20._M_current)->mIndices[0] = (int)fVar42 + 9;
          (iVar20._M_current)->mIndices[1] = (int)fVar42 + 10;
          ppFVar2 = &(this->mFaces).
                     super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppFVar2 = *ppFVar2 + 1;
        }
      }
      uVar41 = uVar41 + 1;
    } while (uVar41 < pNode->mNumChildren);
  }
  uVar41 = ((long)(this->mVertices).
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)(this->mVertices).
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_start >> 2) * -0x5555555555555555 - local_70;
  fVar42 = (float)uVar41;
  if (fVar42 != 0.0) {
    paVar36 = (aiNode *)operator_new(0x460);
    (paVar36->mName).length = 0;
    (paVar36->mName).data[0] = '\0';
    memset((paVar36->mName).data + 1,0x1b,0x3ff);
    (paVar36->mTransformation).a1 = 0.0;
    *(aiVertexWeight **)&(paVar36->mTransformation).b2 = (aiVertexWeight *)0x0;
    ((aiMatrix4x4 *)&(paVar36->mTransformation).b4)->a1 = 1.0;
    (paVar36->mTransformation).c1 = 0.0;
    (paVar36->mTransformation).c2 = 0.0;
    (paVar36->mTransformation).c3 = 0.0;
    (paVar36->mTransformation).c4 = 0.0;
    (paVar36->mTransformation).d1 = 1.0;
    (paVar36->mTransformation).d2 = 0.0;
    (paVar36->mTransformation).d3 = 0.0;
    (paVar36->mTransformation).d4 = 0.0;
    *(float *)&paVar36->field_0x444 = 0.0;
    *(float *)&paVar36->mParent = 1.0;
    *(undefined8 *)((long)&paVar36->mParent + 4) = 0;
    *(undefined8 *)&paVar36->field_0x454 = 0;
    *(float *)((long)&paVar36->mChildren + 4) = 1.0;
    __position._M_current =
         (this->mBones).super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_178._0_8_ = paVar36;
    if (__position._M_current ==
        (this->mBones).super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiBone*,std::allocator<aiBone*>>::_M_realloc_insert<aiBone*const&>
                ((vector<aiBone*,std::allocator<aiBone*>> *)&this->mBones,__position,
                 (aiBone **)&local_178);
    }
    else {
      *__position._M_current = (aiBone *)paVar36;
      pppaVar3 = &(this->mBones).super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppaVar3 = *pppaVar3 + 1;
    }
    uVar25 = local_178._0_8_;
    if ((aiNode *)local_178._0_8_ != pNode) {
      uVar35 = (pNode->mName).length;
      ((aiString *)local_178._0_8_)->length = uVar35;
      memcpy(((aiString *)local_178._0_8_)->data,(pNode->mName).data,(ulong)uVar35);
      ((aiString *)uVar25)->data[uVar35] = '\0';
    }
    uVar21 = (pNode->mTransformation).a1;
    uVar22 = (pNode->mTransformation).a2;
    uVar23 = (pNode->mTransformation).a3;
    uVar24 = (pNode->mTransformation).a4;
    local_168._16_4_ = (pNode->mTransformation).b1;
    local_168._20_4_ = (pNode->mTransformation).b2;
    local_168._24_4_ = (pNode->mTransformation).b3;
    local_168._28_4_ = (pNode->mTransformation).b4;
    local_168._32_4_ = (pNode->mTransformation).c1;
    local_168._36_4_ = (pNode->mTransformation).c2;
    local_168._40_4_ = (pNode->mTransformation).c3;
    local_168._44_4_ = (pNode->mTransformation).c4;
    local_168._48_4_ = (pNode->mTransformation).d1;
    local_168._52_4_ = (pNode->mTransformation).d2;
    ppaStack_130._0_4_ = (pNode->mTransformation).d3;
    ppaStack_130._4_4_ = (pNode->mTransformation).d4;
    local_168._0_4_ = uVar21;
    local_168._4_4_ = uVar22;
    local_168._8_4_ = uVar23;
    local_168._12_4_ = uVar24;
    paVar37 = aiMatrix4x4t<float>::Inverse((aiMatrix4x4t<float> *)local_168);
    fVar43 = paVar37->a2;
    fVar47 = paVar37->a3;
    fVar44 = paVar37->a4;
    fVar45 = paVar37->b1;
    fVar4 = paVar37->b2;
    fVar5 = paVar37->b3;
    fVar6 = paVar37->b4;
    fVar7 = paVar37->c1;
    fVar8 = paVar37->c2;
    paVar36 = *(aiNode **)&paVar37->c3;
    uVar25 = *(undefined8 *)&paVar37->d1;
    ppaVar26 = *(aiNode ***)&paVar37->d3;
    ((aiMatrix4x4 *)(local_178._0_8_ + 0x404))->b4 = paVar37->a1;
    ((aiMatrix4x4 *)(local_178._0_8_ + 0x404))->c1 = fVar43;
    ((aiMatrix4x4 *)(local_178._0_8_ + 0x404))->c2 = fVar47;
    ((aiMatrix4x4 *)(local_178._0_8_ + 0x404))->c3 = fVar44;
    ((aiMatrix4x4 *)(local_178._0_8_ + 0x404))->c4 = fVar45;
    ((aiMatrix4x4 *)(local_178._0_8_ + 0x404))->d1 = fVar4;
    ((aiMatrix4x4 *)(local_178._0_8_ + 0x404))->d2 = fVar5;
    ((aiMatrix4x4 *)(local_178._0_8_ + 0x404))->d3 = fVar6;
    ((aiMatrix4x4 *)(local_178._0_8_ + 0x404))->d4 = fVar7;
    ((aiMatrix4x4 *)(local_178._0_8_ + 0x404))[1].a1 = fVar8;
    *(aiNode **)(local_178._0_8_ + 0x448) = paVar36;
    *(undefined8 *)(local_178._0_8_ + 0x450) = uVar25;
    *(aiNode ***)(local_178._0_8_ + 0x458) = ppaVar26;
    paVar36 = pNode->mParent;
    local_38 = pNode;
    if (paVar36 != (aiNode *)0x0) {
      do {
        uVar27 = (paVar36->mTransformation).a1;
        uVar28 = (paVar36->mTransformation).a2;
        uVar29 = (paVar36->mTransformation).a3;
        uVar30 = (paVar36->mTransformation).a4;
        local_168._16_4_ = (paVar36->mTransformation).b1;
        local_168._20_4_ = (paVar36->mTransformation).b2;
        local_168._24_4_ = (paVar36->mTransformation).b3;
        local_168._28_4_ = (paVar36->mTransformation).b4;
        local_168._32_4_ = (paVar36->mTransformation).c1;
        local_168._36_4_ = (paVar36->mTransformation).c2;
        local_168._40_4_ = (paVar36->mTransformation).c3;
        local_168._44_4_ = (paVar36->mTransformation).c4;
        local_168._48_4_ = (paVar36->mTransformation).d1;
        local_168._52_4_ = (paVar36->mTransformation).d2;
        ppaStack_130._0_4_ = (paVar36->mTransformation).d3;
        ppaStack_130._4_4_ = (paVar36->mTransformation).d4;
        local_168._0_4_ = uVar27;
        local_168._4_4_ = uVar28;
        local_168._8_4_ = uVar29;
        local_168._12_4_ = uVar30;
        paVar37 = aiMatrix4x4t<float>::Inverse((aiMatrix4x4t<float> *)local_168);
        fVar43 = paVar37->a1;
        fVar47 = paVar37->a2;
        fVar44 = paVar37->a3;
        fVar45 = paVar37->a4;
        local_8c = ((aiMatrix4x4 *)(local_178._0_8_ + 0x404))->c4;
        fVar4 = ((aiMatrix4x4 *)&((aiMatrix4x4 *)(local_178._0_8_ + 0x404))->b4)->a1;
        fVar5 = ((aiMatrix4x4 *)(local_178._0_8_ + 0x404))->c1;
        local_118._0_4_ = fVar5;
        local_88 = ((aiMatrix4x4 *)(local_178._0_8_ + 0x404))->d4;
        local_128 = *(float *)(local_178._0_8_ + 0x450);
        fVar46 = local_128 * fVar45 + local_88 * fVar44 + fVar4 * fVar43 + fVar47 * local_8c;
        local_100 = (vector<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
                     *)CONCAT44(local_100._4_4_,fVar46);
        fVar6 = ((aiMatrix4x4 *)(local_178._0_8_ + 0x404))->d1;
        local_f8._0_4_ = fVar6;
        fVar7 = *(float *)(local_178._0_8_ + 0x444);
        local_d8._0_4_ = fVar7;
        local_94 = *(float *)(local_178._0_8_ + 0x454);
        local_c8 = local_94 * fVar45 + fVar7 * fVar44 + fVar5 * fVar43 + fVar47 * fVar6;
        fVar8 = ((aiMatrix4x4 *)(local_178._0_8_ + 0x404))->d2;
        local_e8._0_4_ = fVar8;
        local_16c = ((aiMatrix4x4 *)(local_178._0_8_ + 0x404))->c2;
        local_98 = *(float *)(local_178._0_8_ + 0x448);
        local_58 = *(float *)(local_178._0_8_ + 0x458);
        local_48 = local_58 * fVar45 + local_98 * fVar44 + local_16c * fVar43 + fVar47 * fVar8;
        local_9c = ((aiMatrix4x4 *)(local_178._0_8_ + 0x404))->d3;
        fVar9 = ((aiMatrix4x4 *)(local_178._0_8_ + 0x404))->c3;
        local_b8._0_4_ = fVar9;
        local_68 = *(float *)((long)(local_178._0_8_ + 0x448) + 4);
        local_90 = *(float *)((long)(local_178._0_8_ + 0x458) + 4);
        local_74 = fVar45 * local_90 + fVar44 * local_68 + fVar43 * fVar9 + fVar47 * local_9c;
        fVar43 = paVar37->b2;
        fVar47 = paVar37->b1;
        fVar44 = paVar37->b3;
        fVar45 = paVar37->b4;
        local_78 = local_128 * fVar45 + local_88 * fVar44 + fVar4 * fVar47 + fVar43 * local_8c;
        local_7c = local_94 * fVar45 + fVar7 * fVar44 + fVar5 * fVar47 + fVar43 * fVar6;
        local_80 = local_58 * fVar45 + local_98 * fVar44 + local_16c * fVar47 + fVar43 * fVar8;
        fVar10 = paVar37->c2;
        fVar11 = paVar37->c1;
        fVar12 = paVar37->c3;
        fVar13 = paVar37->c4;
        local_84 = local_128 * fVar13 + local_88 * fVar12 + fVar4 * fVar11 + fVar10 * local_8c;
        fVar14 = paVar37->d2;
        fVar15 = paVar37->d1;
        fVar16 = paVar37->d3;
        fVar17 = paVar37->d4;
        ((aiMatrix4x4 *)&((aiMatrix4x4 *)(local_178._0_8_ + 0x404))->b4)->a1 = fVar46;
        ((aiMatrix4x4 *)(local_178._0_8_ + 0x404))->c1 = local_c8;
        ((aiMatrix4x4 *)(local_178._0_8_ + 0x404))->c2 = local_48;
        ((aiMatrix4x4 *)(local_178._0_8_ + 0x404))->c3 = local_74;
        ((aiMatrix4x4 *)(local_178._0_8_ + 0x404))->c4 = local_78;
        ((aiMatrix4x4 *)(local_178._0_8_ + 0x404))->d1 = local_7c;
        ((aiMatrix4x4 *)(local_178._0_8_ + 0x404))->d2 = local_80;
        ((aiMatrix4x4 *)(local_178._0_8_ + 0x404))->d3 =
             fVar45 * local_90 + fVar44 * local_68 + fVar47 * fVar9 + fVar43 * local_9c;
        ((aiMatrix4x4 *)(local_178._0_8_ + 0x404))->d4 = local_84;
        *(float *)(local_178._0_8_ + 0x444) =
             local_94 * fVar13 + fVar7 * fVar12 + fVar5 * fVar11 + fVar10 * fVar6;
        *(float *)(local_178._0_8_ + 0x448) =
             local_58 * fVar13 + local_98 * fVar12 + local_16c * fVar11 + fVar10 * fVar8;
        *(float *)((long)(local_178._0_8_ + 0x448) + 4) =
             fVar13 * local_90 + fVar12 * local_68 + fVar11 * fVar9 + fVar10 * local_9c;
        *(float *)(local_178._0_8_ + 0x450) =
             local_128 * fVar17 + local_88 * fVar16 + fVar4 * fVar15 + local_8c * fVar14;
        *(float *)(local_178._0_8_ + 0x454) =
             local_94 * fVar17 + fVar7 * fVar16 + fVar5 * fVar15 + fVar6 * fVar14;
        *(float *)(local_178._0_8_ + 0x458) =
             local_58 * fVar17 + local_98 * fVar16 + local_16c * fVar15 + fVar8 * fVar14;
        *(float *)((long)(local_178._0_8_ + 0x458) + 4) =
             local_90 * fVar17 + local_68 * fVar16 + fVar9 * fVar15 + fVar14 * local_9c;
        paVar36 = paVar36->mParent;
      } while (paVar36 != (aiNode *)0x0);
    }
    uVar25 = local_178._0_8_;
    ((aiMatrix4x4 *)(local_178._0_8_ + 0x404))->a1 = fVar42;
    uVar41 = (uVar41 & 0xffffffff) << 3;
    paVar38 = (aiVertexWeight *)operator_new__(uVar41);
    uVar40 = 0;
    memset(paVar38,0,uVar41);
    uVar41 = local_70;
    *(aiVertexWeight **)&((aiMatrix4x4 *)(uVar25 + 0x404))->b2 = paVar38;
    do {
      uVar35 = (uint)local_70;
      paVar38 = *(aiVertexWeight **)&((aiMatrix4x4 *)(local_178._0_8_ + 0x404))->b2;
      paVar38[uVar40].mVertexId = uVar35 + (int)uVar40;
      paVar38[uVar40].mWeight = 1.0;
      uVar40 = uVar40 + 1;
    } while ((int)fVar42 + (uint)(fVar42 == 0.0) != uVar40);
    uVar31 = ((aiMatrix4x4 *)(local_178._0_8_ + 0x404))->b4;
    uVar32 = ((aiMatrix4x4 *)(local_178._0_8_ + 0x404))->c1;
    uVar33 = ((aiMatrix4x4 *)(local_178._0_8_ + 0x404))->c2;
    uVar34 = ((aiMatrix4x4 *)(local_178._0_8_ + 0x404))->c3;
    local_168._16_4_ = ((aiMatrix4x4 *)(local_178._0_8_ + 0x404))->c4;
    local_168._20_4_ = ((aiMatrix4x4 *)(local_178._0_8_ + 0x404))->d1;
    local_168._24_4_ = ((aiMatrix4x4 *)(local_178._0_8_ + 0x404))->d2;
    local_168._28_4_ = ((aiMatrix4x4 *)(local_178._0_8_ + 0x404))->d3;
    local_168._32_4_ = ((aiMatrix4x4 *)(local_178._0_8_ + 0x404))->d4;
    local_168._36_4_ = ((aiMatrix4x4 *)(local_178._0_8_ + 0x404))[1].a1;
    local_168._40_8_ = *(aiNode **)(local_178._0_8_ + 0x448);
    local_168._48_8_ = *(undefined8 *)(local_178._0_8_ + 0x450);
    ppaStack_130 = *(aiNode ***)(local_178._0_8_ + 0x458);
    local_168._0_4_ = uVar31;
    local_168._4_4_ = uVar32;
    local_168._8_4_ = uVar33;
    local_168._12_4_ = uVar34;
    paVar37 = aiMatrix4x4t<float>::Inverse((aiMatrix4x4t<float> *)local_168);
    uVar41 = uVar41 & 0xffffffff;
    paVar39 = (this->mVertices).
              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar40 = ((long)(this->mVertices).
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)paVar39 >> 2) *
             -0x5555555555555555;
    pNode = local_38;
    if (uVar41 <= uVar40 && uVar40 - uVar41 != 0) {
      fVar42 = paVar37->a1;
      local_118._0_4_ = fVar42;
      local_128 = paVar37->a2;
      fVar43 = paVar37->a3;
      fVar47 = paVar37->a4;
      fVar44 = paVar37->b1;
      fVar45 = paVar37->b2;
      fVar4 = paVar37->b3;
      fVar5 = paVar37->b4;
      fVar6 = paVar37->c1;
      fVar7 = paVar37->c2;
      fVar8 = paVar37->c3;
      fVar9 = paVar37->c4;
      do {
        uVar35 = uVar35 + 1;
        fVar10 = paVar39[uVar41].x;
        fVar11 = paVar39[uVar41].y;
        fVar12 = paVar39[uVar41].z;
        paVar39[uVar41].x = fVar43 * fVar12 + fVar42 * fVar10 + local_128 * fVar11 + fVar47;
        paVar39[uVar41].y = fVar4 * fVar12 + fVar44 * fVar10 + fVar45 * fVar11 + fVar5;
        paVar39[uVar41].z = fVar12 * fVar8 + fVar10 * fVar6 + fVar11 * fVar7 + fVar9;
        uVar41 = (ulong)uVar35;
        paVar39 = (this->mVertices).
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_start;
        uVar40 = ((long)(this->mVertices).
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)paVar39 >> 2) *
                 -0x5555555555555555;
      } while (uVar41 <= uVar40 && uVar40 - uVar41 != 0);
    }
  }
  if (pNode->mNumChildren != 0) {
    uVar41 = 0;
    do {
      CreateGeometry(this,pNode->mChildren[uVar41]);
      uVar41 = uVar41 + 1;
    } while (uVar41 < pNode->mNumChildren);
  }
  return;
}

Assistant:

void SkeletonMeshBuilder::CreateGeometry( const aiNode* pNode)
{
    // add a joint entry for the node.
    const unsigned int vertexStartIndex = static_cast<unsigned int>(mVertices.size());

    // now build the geometry.
    if( pNode->mNumChildren > 0 && !mKnobsOnly)
    {
        // If the node has children, we build little pointers to each of them
        for( unsigned int a = 0; a < pNode->mNumChildren; a++)
        {
            // find a suitable coordinate system
            const aiMatrix4x4& childTransform = pNode->mChildren[a]->mTransformation;
            aiVector3D childpos( childTransform.a4, childTransform.b4, childTransform.c4);
            ai_real distanceToChild = childpos.Length();
            if( distanceToChild < 0.0001)
                continue;
            aiVector3D up = aiVector3D( childpos).Normalize();

            aiVector3D orth( 1.0, 0.0, 0.0);
            if( std::fabs( orth * up) > 0.99)
                orth.Set( 0.0, 1.0, 0.0);

            aiVector3D front = (up ^ orth).Normalize();
            aiVector3D side = (front ^ up).Normalize();

            unsigned int localVertexStart = static_cast<unsigned int>(mVertices.size());
            mVertices.push_back( -front * distanceToChild * (ai_real)0.1);
            mVertices.push_back( childpos);
            mVertices.push_back( -side * distanceToChild * (ai_real)0.1);
            mVertices.push_back( -side * distanceToChild * (ai_real)0.1);
            mVertices.push_back( childpos);
            mVertices.push_back( front * distanceToChild * (ai_real)0.1);
            mVertices.push_back( front * distanceToChild * (ai_real)0.1);
            mVertices.push_back( childpos);
            mVertices.push_back( side * distanceToChild * (ai_real)0.1);
            mVertices.push_back( side * distanceToChild * (ai_real)0.1);
            mVertices.push_back( childpos);
            mVertices.push_back( -front * distanceToChild * (ai_real)0.1);

            mFaces.push_back( Face( localVertexStart + 0, localVertexStart + 1, localVertexStart + 2));
            mFaces.push_back( Face( localVertexStart + 3, localVertexStart + 4, localVertexStart + 5));
            mFaces.push_back( Face( localVertexStart + 6, localVertexStart + 7, localVertexStart + 8));
            mFaces.push_back( Face( localVertexStart + 9, localVertexStart + 10, localVertexStart + 11));
        }
    }
    else
    {
        // if the node has no children, it's an end node. Put a little knob there instead
        aiVector3D ownpos( pNode->mTransformation.a4, pNode->mTransformation.b4, pNode->mTransformation.c4);
        ai_real sizeEstimate = ownpos.Length() * ai_real( 0.18 );

        mVertices.push_back( aiVector3D( -sizeEstimate, 0.0, 0.0));
        mVertices.push_back( aiVector3D( 0.0, sizeEstimate, 0.0));
        mVertices.push_back( aiVector3D( 0.0, 0.0, -sizeEstimate));
        mVertices.push_back( aiVector3D( 0.0, sizeEstimate, 0.0));
        mVertices.push_back( aiVector3D( sizeEstimate, 0.0, 0.0));
        mVertices.push_back( aiVector3D( 0.0, 0.0, -sizeEstimate));
        mVertices.push_back( aiVector3D( sizeEstimate, 0.0, 0.0));
        mVertices.push_back( aiVector3D( 0.0, -sizeEstimate, 0.0));
        mVertices.push_back( aiVector3D( 0.0, 0.0, -sizeEstimate));
        mVertices.push_back( aiVector3D( 0.0, -sizeEstimate, 0.0));
        mVertices.push_back( aiVector3D( -sizeEstimate, 0.0, 0.0));
        mVertices.push_back( aiVector3D( 0.0, 0.0, -sizeEstimate));

        mVertices.push_back( aiVector3D( -sizeEstimate, 0.0, 0.0));
        mVertices.push_back( aiVector3D( 0.0, 0.0, sizeEstimate));
        mVertices.push_back( aiVector3D( 0.0, sizeEstimate, 0.0));
        mVertices.push_back( aiVector3D( 0.0, sizeEstimate, 0.0));
        mVertices.push_back( aiVector3D( 0.0, 0.0, sizeEstimate));
        mVertices.push_back( aiVector3D( sizeEstimate, 0.0, 0.0));
        mVertices.push_back( aiVector3D( sizeEstimate, 0.0, 0.0));
        mVertices.push_back( aiVector3D( 0.0, 0.0, sizeEstimate));
        mVertices.push_back( aiVector3D( 0.0, -sizeEstimate, 0.0));
        mVertices.push_back( aiVector3D( 0.0, -sizeEstimate, 0.0));
        mVertices.push_back( aiVector3D( 0.0, 0.0, sizeEstimate));
        mVertices.push_back( aiVector3D( -sizeEstimate, 0.0, 0.0));

        mFaces.push_back( Face( vertexStartIndex + 0, vertexStartIndex + 1, vertexStartIndex + 2));
        mFaces.push_back( Face( vertexStartIndex + 3, vertexStartIndex + 4, vertexStartIndex + 5));
        mFaces.push_back( Face( vertexStartIndex + 6, vertexStartIndex + 7, vertexStartIndex + 8));
        mFaces.push_back( Face( vertexStartIndex + 9, vertexStartIndex + 10, vertexStartIndex + 11));
        mFaces.push_back( Face( vertexStartIndex + 12, vertexStartIndex + 13, vertexStartIndex + 14));
        mFaces.push_back( Face( vertexStartIndex + 15, vertexStartIndex + 16, vertexStartIndex + 17));
        mFaces.push_back( Face( vertexStartIndex + 18, vertexStartIndex + 19, vertexStartIndex + 20));
        mFaces.push_back( Face( vertexStartIndex + 21, vertexStartIndex + 22, vertexStartIndex + 23));
    }

    unsigned int numVertices = static_cast<unsigned int>(mVertices.size() - vertexStartIndex);
    if( numVertices > 0)
    {
        // create a bone affecting all the newly created vertices
        aiBone* bone = new aiBone;
        mBones.push_back( bone);
        bone->mName = pNode->mName;

        // calculate the bone offset matrix by concatenating the inverse transformations of all parents
        bone->mOffsetMatrix = aiMatrix4x4( pNode->mTransformation).Inverse();
        for( aiNode* parent = pNode->mParent; parent != NULL; parent = parent->mParent)
            bone->mOffsetMatrix = aiMatrix4x4( parent->mTransformation).Inverse() * bone->mOffsetMatrix;

        // add all the vertices to the bone's influences
        bone->mNumWeights = numVertices;
        bone->mWeights = new aiVertexWeight[numVertices];
        for( unsigned int a = 0; a < numVertices; a++)
            bone->mWeights[a] = aiVertexWeight( vertexStartIndex + a, 1.0);

        // HACK: (thom) transform all vertices to the bone's local space. Should be done before adding
        // them to the array, but I'm tired now and I'm annoyed.
        aiMatrix4x4 boneToMeshTransform = aiMatrix4x4( bone->mOffsetMatrix).Inverse();
        for( unsigned int a = vertexStartIndex; a < mVertices.size(); a++)
            mVertices[a] = boneToMeshTransform * mVertices[a];
    }

    // and finally recurse into the children list
    for( unsigned int a = 0; a < pNode->mNumChildren; a++)
        CreateGeometry( pNode->mChildren[a]);
}